

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O0

void helper_chsc(CPUS390XState_conflict *env,uint64_t inst)

{
  uint64_t inst_local;
  CPUS390XState_conflict *env_local;
  
  return;
}

Assistant:

void HELPER(chsc)(CPUS390XState *env, uint64_t inst)
{
#if 0
    S390CPU *cpu = env_archcpu(env);
    qemu_mutex_lock_iothread();
    ioinst_handle_chsc(cpu, inst >> 16, GETPC());
    qemu_mutex_unlock_iothread();
#endif
}